

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CFGReader.cpp
# Opt level: O3

void CFGReader::markIndirect(CfgNode *node)

{
  if (node->m_type != CFG_BLOCK) {
    __assert_fail("node->type() == CfgNode::CFG_BLOCK",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/rimsa[P]cfgconv/src/CFGReader.cpp"
                  ,0x75,"static void CFGReader::markIndirect(CfgNode *)");
  }
  if ((BlockData *)node->m_data != (BlockData *)0x0) {
    CfgNode::BlockData::setIndirect((BlockData *)node->m_data,true);
    return;
  }
  __assert_fail("data != 0",
                "/workspace/llm4binary/github/license_all_cmakelists_25/rimsa[P]cfgconv/src/CFGReader.cpp"
                ,0x78,"static void CFGReader::markIndirect(CfgNode *)");
}

Assistant:

void CFGReader::markIndirect(CfgNode* node) {
	assert(node->type() == CfgNode::CFG_BLOCK);
	CfgNode::BlockData* data =
		static_cast<CfgNode::BlockData*>(node->data());
	assert(data != 0);
	data->setIndirect(true);
}